

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O2

void __thiscall
Rml::FilterDropShadowInstancer::FilterDropShadowInstancer(FilterDropShadowInstancer *this)

{
  EffectSpecification *this_00;
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  FilterInstancer::FilterInstancer(&this->super_FilterInstancer);
  (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)&PTR__FilterInstancer_003989d0
  ;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"color",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"transparent",&local_9a);
  this_00 = &(this->super_FilterInstancer).super_EffectSpecification;
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"color",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"offset-x",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"length",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).offset_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"offset-y",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"length",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).offset_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"sigma",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar2 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"length",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_38,&local_58);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).sigma = PVar1;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"filter",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"color, offset-x, offset-y, sigma",(allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand(this_00,&local_78,&local_98,FallThrough);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

FilterDropShadowInstancer::FilterDropShadowInstancer()
{
	ids.color = RegisterProperty("color", "transparent").AddParser("color").GetId();
	ids.offset_x = RegisterProperty("offset-x", "0px").AddParser("length").GetId();
	ids.offset_y = RegisterProperty("offset-y", "0px").AddParser("length").GetId();
	ids.sigma = RegisterProperty("sigma", "0px").AddParser("length").GetId();
	RegisterShorthand("filter", "color, offset-x, offset-y, sigma", ShorthandType::FallThrough);
}